

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workqueue.h
# Opt level: O2

void __thiscall rengine::WorkQueue::run(WorkQueue *this)

{
  list<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
  *this_00;
  _List_node_base *p_Var1;
  byte bVar2;
  undefined1 local_60 [8];
  unique_lock<std::mutex> locker;
  undefined1 auStack_48 [8];
  shared_ptr<rengine::WorkQueue::Job> job;
  
  bVar2 = this->m_running;
  this_00 = &this->m_jobs;
  locker._8_8_ = &this->m_condition;
  do {
    if ((bVar2 & 1) == 0) {
      return;
    }
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_60,&this->m_mutex);
    p_Var1 = (this_00->
             super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)this_00) {
      std::condition_variable::wait((unique_lock *)locker._8_8_);
      p_Var1 = (this_00->
               super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
    }
    auStack_48 = (undefined1  [8])0x0;
    job.super___shared_ptr<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    if (p_Var1 != (_List_node_base *)this_00) {
      std::__shared_ptr<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2> *)auStack_48,
                 (__shared_ptr<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2> *)(p_Var1 + 1));
      std::__cxx11::
      list<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
      ::pop_front(this_00);
    }
    bVar2 = this->m_running;
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_60);
    if (((bool)bVar2 != false) && (auStack_48 != (undefined1  [8])0x0)) {
      if (*(bool *)((long)auStack_48 + 0x60) == true) {
        __assert_fail("!job->m_completed",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/workqueue.h"
                      ,0x9f,"void rengine::WorkQueue::run()");
      }
      (*(*(_func_int ***)auStack_48)[2])();
      std::mutex::lock((mutex *)((long)auStack_48 + 8));
      *(bool *)((long)auStack_48 + 0x60) = true;
      std::condition_variable::notify_one();
      pthread_mutex_unlock((pthread_mutex_t *)((long)auStack_48 + 8));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&job);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
  } while( true );
}

Assistant:

inline void WorkQueue::run()
{
    bool running = m_running;
    while (running) {
        std::unique_lock<std::mutex> locker(m_mutex);
        if (m_jobs.empty()) {
            m_condition.wait(locker);
        }
        std::shared_ptr<Job> job;
        if (!m_jobs.empty()) {
            job = m_jobs.front();
            m_jobs.pop_front();
        }

        // While still holding the mutex, check if we should abort..
        running = m_running;
        locker.unlock();

        // Then, if we're still running, execute the job, mark it completed
        // and then the signal potential waiter.
        if (running && job.get() != nullptr) {
            assert(!job->m_completed);
            job->onExecute();
            job->m_mutex.lock();
            job->m_completed = true;
            job->m_condition.notify_one();
            job->m_mutex.unlock();
        }
    }
}